

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void soul::StructuralParser::recursivelyReplaceParentScope(Expression *target,Scope *newScope)

{
  ScopeReplacingVisitor v;
  undefined **local_18;
  Scope *local_10;
  Scope *local_8;
  
  local_18 = &PTR__ASTVisitor_0032f490;
  local_10 = (target->super_Statement).super_ASTObject.context.parentScope;
  local_8 = newScope;
  recursivelyReplaceParentScope(soul::AST::Expression&,soul::AST::Scope&)::ScopeReplacingVisitor::
  visitObject(soul::AST::Expression__(&local_18,target);
  return;
}

Assistant:

static void recursivelyReplaceParentScope (AST::Expression& target, AST::Scope& newScope)
    {
        struct ScopeReplacingVisitor  : public ASTVisitor
        {
            void visitObject (AST::Expression& e) override
            {
                ASTVisitor::visitObject (e);

                if (e.context.parentScope == oldScope)
                    e.context.parentScope = newScope;
            }

            AST::Scope* oldScope;
            AST::Scope* newScope;
        };

        ScopeReplacingVisitor v;
        v.oldScope = target.context.parentScope;
        v.newScope = std::addressof (newScope);
        v.visitObject (target);
    }